

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  bool bVar1;
  uchar local_88 [8];
  uchar buf [64];
  mbedtls_entropy_context *ctx;
  int done;
  int i;
  int count;
  int ret;
  size_t len_local;
  uchar *output_local;
  void *data_local;
  
  done = 0;
  if (len < 0x41) {
    do {
      if (0x100 < done) {
        i = -0x3c;
        goto LAB_002398dc;
      }
      i = entropy_gather_internal((mbedtls_entropy_context *)data);
      if (i != 0) goto LAB_002398dc;
      bVar1 = true;
      for (ctx._4_4_ = 0; ctx._4_4_ < *(int *)((long)data + 0xd8); ctx._4_4_ = ctx._4_4_ + 1) {
        if (*(ulong *)((long)data + (long)ctx._4_4_ * 0x28 + 0xf0) <
            *(ulong *)((long)data + (long)ctx._4_4_ * 0x28 + 0xf8)) {
          bVar1 = false;
        }
      }
      done = done + 1;
    } while (!bVar1);
    memset(local_88,0,0x40);
    mbedtls_sha512_finish((mbedtls_sha512_context *)data,local_88);
    memset(data,0,0xd8);
    mbedtls_sha512_starts((mbedtls_sha512_context *)data,0);
    mbedtls_sha512_update((mbedtls_sha512_context *)data,local_88,0x40);
    mbedtls_sha512(local_88,0x40,local_88,0);
    for (ctx._4_4_ = 0; ctx._4_4_ < *(int *)((long)data + 0xd8); ctx._4_4_ = ctx._4_4_ + 1) {
      *(undefined8 *)((long)data + (long)ctx._4_4_ * 0x28 + 0xf0) = 0;
    }
    memcpy(output,local_88,len);
    i = 0;
LAB_002398dc:
    data_local._4_4_ = i;
  }
  else {
    data_local._4_4_ = -0x3c;
  }
  return data_local._4_4_;
}

Assistant:

int mbedtls_entropy_func( void *data, unsigned char *output, size_t len )
{
    int ret, count = 0, i, done;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( len > MBEDTLS_ENTROPY_BLOCK_SIZE )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    /*
     * Always gather extra entropy before a call
     */
    do
    {
        if( count++ > ENTROPY_MAX_LOOP )
        {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if( ( ret = entropy_gather_internal( ctx ) ) != 0 )
            goto exit;

        done = 1;
        for( i = 0; i < ctx->source_count; i++ )
            if( ctx->source[i].size < ctx->source[i].threshold )
                done = 0;
    }
    while( ! done );

    memset( buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE );

#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    mbedtls_sha512_finish( &ctx->accumulator, buf );

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    memset( &ctx->accumulator, 0, sizeof( mbedtls_sha512_context ) );
    mbedtls_sha512_starts( &ctx->accumulator, 0 );
    mbedtls_sha512_update( &ctx->accumulator, buf, MBEDTLS_ENTROPY_BLOCK_SIZE );

    /*
     * Perform second SHA-512 on entropy
     */
    mbedtls_sha512( buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf, 0 );
#else /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */
    mbedtls_sha256_finish( &ctx->accumulator, buf );

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    memset( &ctx->accumulator, 0, sizeof( mbedtls_sha256_context ) );
    mbedtls_sha256_starts( &ctx->accumulator, 0 );
    mbedtls_sha256_update( &ctx->accumulator, buf, MBEDTLS_ENTROPY_BLOCK_SIZE );

    /*
     * Perform second SHA-256 on entropy
     */
    mbedtls_sha256( buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf, 0 );
#endif /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */

    for( i = 0; i < ctx->source_count; i++ )
        ctx->source[i].size = 0;

    memcpy( output, buf, len );

    ret = 0;

exit:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}